

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pTextureUploadTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles2::Performance::TextureUploadAndDrawCase::iterate(TextureUploadAndDrawCase *this)

{
  qpTestResult qVar1;
  State SVar2;
  int iVar3;
  deUint32 err;
  deUint64 dVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  int local_2c;
  int i;
  int numCalls;
  State state;
  deUint64 curTime;
  TextureUploadAndDrawCase *this_local;
  
  qVar1 = tcu::TestContext::getTestResult
                    ((this->super_TextureUploadCase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx);
  if (qVar1 == QP_TEST_RESULT_NOT_SUPPORTED) {
    this_local._4_4_ = STOP;
  }
  else {
    if ((this->m_lastIterationRender & 1U) != 0) {
      SVar2 = deqp::gls::TheilSenCalibrator::getState(&(this->super_TextureUploadCase).m_calibrator)
      ;
      if (SVar2 == STATE_MEASURE) {
        dVar4 = deGetMicroseconds();
        deqp::gls::TheilSenCalibrator::recordIteration
                  (&(this->super_TextureUploadCase).m_calibrator,dVar4 - this->m_renderStart);
      }
    }
    SVar2 = deqp::gls::TheilSenCalibrator::getState(&(this->super_TextureUploadCase).m_calibrator);
    if (SVar2 == STATE_MEASURE) {
      iVar3 = deqp::gls::TheilSenCalibrator::getCallCount
                        (&(this->super_TextureUploadCase).m_calibrator);
      dVar4 = deGetMicroseconds();
      this->m_renderStart = dVar4;
      this->m_lastIterationRender = true;
      for (local_2c = 0; local_2c < iVar3; local_2c = local_2c + 1) {
        render(this);
      }
      this_local._4_4_ = CONTINUE;
    }
    else if (SVar2 == STATE_RECOMPUTE_PARAMS) {
      deqp::gls::TheilSenCalibrator::recomputeParameters
                (&(this->super_TextureUploadCase).m_calibrator);
      this->m_lastIterationRender = false;
      this_local._4_4_ = CONTINUE;
    }
    else {
      pRVar5 = gles2::Context::getRenderContext
                         ((this->super_TextureUploadCase).super_TestCase.m_context);
      iVar3 = (*pRVar5->_vptr_RenderContext[3])();
      err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
      glu::checkError(err,"finish",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/performance/es2pTextureUploadTests.cpp"
                      ,0x1d0);
      TextureUploadCase::logResults(&this->super_TextureUploadCase);
      this_local._4_4_ = STOP;
    }
  }
  return this_local._4_4_;
}

Assistant:

tcu::TestNode::IterateResult TextureUploadAndDrawCase::iterate (void)
{
	if (m_testCtx.getTestResult() == QP_TEST_RESULT_NOT_SUPPORTED)
		return STOP;

	if (m_lastIterationRender && (m_calibrator.getState() == gls::TheilSenCalibrator::STATE_MEASURE))
	{
		deUint64 curTime = deGetMicroseconds();
		m_calibrator.recordIteration(curTime - m_renderStart);
	}

	gls::TheilSenCalibrator::State state = m_calibrator.getState();

	if (state == gls::TheilSenCalibrator::STATE_MEASURE)
	{
		// Render
		int	numCalls = m_calibrator.getCallCount();

		m_renderStart			= deGetMicroseconds();
		m_lastIterationRender	= true;

		for (int i = 0; i < numCalls; i++)
			render();

		return CONTINUE;
	}
	else if (state == gls::TheilSenCalibrator::STATE_RECOMPUTE_PARAMS)
	{
		m_calibrator.recomputeParameters();
		m_lastIterationRender = false;
		return CONTINUE;
	}
	else
	{
		DE_ASSERT(state == gls::TheilSenCalibrator::STATE_FINISHED);
		GLU_EXPECT_NO_ERROR(m_context.getRenderContext().getFunctions().getError(), "finish");
		logResults();
		return STOP;
	}
}